

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O1

void test_cpp_wrapper_update_all(planck_unit_test_t *tc,Dictionary<int,_int> *dict)

{
  int iVar1;
  uint uVar2;
  
  cpp_wrapper_setup(tc,dict,ion_fill_edge_cases);
  iVar1 = 0;
  do {
    cpp_wrapper_update(tc,dict,iVar1,-0x539,'\0',1,'\x01');
    iVar1 = iVar1 + 1;
  } while (iVar1 != 10);
  uVar2 = 0x30;
  do {
    uVar2 = uVar2 + 2;
    cpp_wrapper_update(tc,dict,uVar2,-0x539,'\0',1,'\x01');
  } while (uVar2 < 0x62);
  uVar2 = 0x1ef;
  do {
    uVar2 = uVar2 + 5;
    cpp_wrapper_update(tc,dict,uVar2,-0x539,'\0',1,'\x01');
  } while (uVar2 < 0x3e3);
  iVar1 = -0x66;
  do {
    iVar1 = iVar1 + 2;
    cpp_wrapper_update(tc,dict,iVar1,-0x539,'\0',1,'\x01');
  } while (iVar1 < -0x34);
  return;
}

Assistant:

void
test_cpp_wrapper_update_all(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict
) {
	cpp_wrapper_setup(tc, dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		cpp_wrapper_update(tc, dict, i, -1337, err_ok, 1, boolean_true);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		cpp_wrapper_update(tc, dict, i, -1337, err_ok, 1, boolean_true);
	}
	ION_FILL_HIGH_LOOP(i) {
		cpp_wrapper_update(tc, dict, i, -1337, err_ok, 1, boolean_true);
	}
	ION_FILL_EDGE_LOOP(i) {
		cpp_wrapper_update(tc, dict, i, -1337, err_ok, 1, boolean_true);
	}
}